

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

void __thiscall
VulkanHppGenerator::addCommandsToHandle
          (VulkanHppGenerator *this,
          vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
          *requireData)

{
  pointer pRVar1;
  pointer pNVar2;
  iterator iVar3;
  iterator iVar4;
  const_iterator cVar5;
  pointer pRVar6;
  pointer name;
  
  pRVar6 = (requireData->
           super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (requireData->
           super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar6 != pRVar1) {
    do {
      pNVar2 = (pRVar6->commands).
               super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (name = (pRVar6->commands).
                  super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                  ._M_impl.super__Vector_impl_data._M_start; name != pNVar2; name = name + 1) {
        iVar3 = anon_unknown.dwarf_1900a8::findByNameOrAlias<VulkanHppGenerator::CommandData>
                          (&this->m_commands,&name->name);
        if ((_Rb_tree_header *)iVar3._M_node ==
            &(this->m_commands)._M_t._M_impl.super__Rb_tree_header) {
          __assert_fail("commandIt != m_commands.end()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x23f,
                        "void VulkanHppGenerator::addCommandsToHandle(const std::vector<RequireData> &)"
                       );
        }
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>_>
                ::find(&(this->m_handles)._M_t,(key_type *)&iVar3._M_node[4]._M_parent);
        if ((_Rb_tree_header *)iVar4._M_node ==
            &(this->m_handles)._M_t._M_impl.super__Rb_tree_header) {
          __assert_fail("handleIt != m_handles.end()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x241,
                        "void VulkanHppGenerator::addCommandsToHandle(const std::vector<RequireData> &)"
                       );
        }
        cVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(iVar4._M_node + 5,&name->name);
        if (cVar5._M_node == (_Base_ptr)&iVar4._M_node[5]._M_parent) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)(iVar4._M_node + 5),&name->name);
          registerDeleter(this,&name->name,(CommandData *)(iVar3._M_node + 2));
        }
      }
      pRVar6 = pRVar6 + 1;
    } while (pRVar6 != pRVar1);
  }
  return;
}

Assistant:

void VulkanHppGenerator::addCommandsToHandle( std::vector<RequireData> const & requireData )
{
  for ( auto const & require : requireData )
  {
    for ( auto const & command : require.commands )
    {
      auto commandIt = findByNameOrAlias( m_commands, command.name );
      assert( commandIt != m_commands.end() );
      auto handleIt = m_handles.find( commandIt->second.handle );
      assert( handleIt != m_handles.end() );
      if ( !handleIt->second.commands.contains( command.name ) )
      {
        handleIt->second.commands.insert( command.name );
        registerDeleter( command.name, commandIt->second );
      }
    }
  }
}